

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  ImGuiWindow *pIVar1;
  ImGuiDockNode *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ulong uVar4;
  byte bVar5;
  ushort uVar6;
  ImGuiDockNodeFlags *pIVar7;
  uint uVar8;
  long lVar9;
  ImGuiWindow *pIVar10;
  ushort uVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ImVec2 size_new;
  ImVec2 pos_old;
  ImVec2 pos_new;
  ImVec2 size_old;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar3 = GImGui;
  pIVar10 = (ImGuiWindow *)host_node;
  if ((host_node != (ImGuiDockNode *)0x0) &&
     (pIVar1 = (ImGuiWindow *)host_node, (host_node->field_0xc5 & 2) == 0)) {
    do {
      pIVar10 = pIVar1;
      pIVar1 = *(ImGuiWindow **)&(pIVar10->WindowClass).ParentViewportId;
    } while (pIVar1 != (ImGuiWindow *)0x0);
  }
  pIVar2 = root_payload->DockNodeAsHost;
  if ((pIVar10 != (ImGuiWindow *)0x0) && (((uint)(pIVar10->ScrollbarSizes).y & 0x200) == 0)) {
    __assert_fail("ref_node_for_rect->IsVisible",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x3d34,
                  "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                 );
  }
  pIVar7 = &pIVar2->MergedFlags;
  if (pIVar2 == (ImGuiDockNode *)0x0) {
    pIVar7 = &(root_payload->WindowClass).DockNodeFlagsOverrideSet;
  }
  uVar8 = *pIVar7;
  pIVar7 = &(host_window->WindowClass).DockNodeFlagsOverrideSet;
  if (host_node != (ImGuiDockNode *)0x0) {
    pIVar7 = &host_node->MergedFlags;
  }
  uVar14 = *pIVar7;
  data->IsCenterAvailable = true;
  if (((uVar14 & 0x10000) == 0 && !is_outer_docking) &&
     ((((byte)((uVar14 & 4) >> 2) & host_node != (ImGuiDockNode *)0x0) != 1 ||
      ((host_node->MergedFlags & 0x800) == 0)))) {
    if (host_node == (ImGuiDockNode *)0x0) {
      if (pIVar2 != (ImGuiDockNode *)0x0) goto LAB_0016f631;
LAB_0016f657:
      if ((uVar14 >> 0x13 & 1) != 0) goto LAB_0016ef8e;
    }
    else {
      if ((pIVar2 == (ImGuiDockNode *)0x0) ||
         (host_node->ChildNodes[0] == (ImGuiDockNode *)0x0 && (host_node->Windows).Size == 0))
      goto LAB_0016f657;
LAB_0016f631:
      if (pIVar2->ChildNodes[0] == (ImGuiDockNode *)0x0) goto LAB_0016f657;
      if (pIVar2->OnlyNodeWithWindows == (ImGuiDockNode *)0x0 || (uVar14 >> 0x13 & 1) != 0)
      goto LAB_0016ef8e;
    }
    if ((((uVar8 >> 0x14 & 1) == 0) ||
        (((host_node != (ImGuiDockNode *)0x0 && (host_node->ChildNodes[0] == (ImGuiDockNode *)0x0))
         && ((host_node->Windows).Size == 0)))) &&
       ((((host_node == (ImGuiDockNode *)0x0 || ((uVar8 & 0x200000) == 0)) ||
         (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0)) || ((host_node->Windows).Size != 0))))
    goto LAB_0016ef95;
  }
LAB_0016ef8e:
  data->IsCenterAvailable = false;
LAB_0016ef95:
  data->IsSidesAvailable = true;
  if ((((uVar14 & 0x10) != 0) || ((pIVar3->IO).ConfigDockingNoSplit != false)) ||
     (((host_node != (ImGuiDockNode *)0x0 && !is_outer_docking &&
       ((host_node->ParentNode == (ImGuiDockNode *)0x0 && ((host_node->MergedFlags & 0x800) != 0))))
      || ((uVar8 & 0x40000) != 0 || (uVar14 & 0x20000) != 0)))) {
    data->IsSidesAvailable = false;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    bVar5 = host_window->HasCloseButton;
  }
  else {
    bVar5 = (host_node->field_0xc5 & 0x10) >> 4;
  }
  uVar11 = 0x1000;
  if (bVar5 == 0) {
    uVar11 = (ushort)root_payload->HasCloseButton << 0xc;
  }
  uVar11 = uVar11 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xc4 & 0xefff;
  *(ushort *)&(data->FutureNode).field_0xc4 = uVar11;
  uVar6 = 0x2000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar6 = (ushort)((~host_window->Flags & 0x20U) << 8);
  }
  *(ushort *)&(data->FutureNode).field_0xc4 = uVar6 | uVar11 & 0xdfff;
  if (pIVar10 == (ImGuiWindow *)0x0) {
    pIVar10 = host_window;
  }
  (data->FutureNode).Pos = pIVar10->Pos;
  (data->FutureNode).Size = pIVar10->Size;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar8 = 0xffffffff;
    lVar9 = 0;
    do {
      bVar13 = lVar9 == 0;
      if (bVar13) {
        if (data->IsCenterAvailable != false) goto LAB_0016f139;
      }
      else {
        if (data->IsSidesAvailable != true) goto LAB_0016f471;
LAB_0016f139:
        fVar16 = (data->FutureNode).Pos.x;
        fVar17 = (data->FutureNode).Pos.y;
        fVar23 = (data->FutureNode).Size.x + fVar16;
        fVar22 = (data->FutureNode).Size.y + fVar17;
        fVar19 = fVar23 - fVar16;
        fVar18 = fVar22 - fVar17;
        fVar15 = fVar19;
        if (fVar18 <= fVar19) {
          fVar15 = fVar18;
        }
        fVar20 = pIVar3->FontSize * 1.5;
        fVar21 = pIVar3->FontSize * 0.5;
        uVar14 = -(uint)(fVar15 * 0.125 <= fVar21);
        fVar15 = (float)(uVar14 & (uint)fVar21 | ~uVar14 & (uint)(fVar15 * 0.125));
        if (fVar15 <= fVar20) {
          fVar20 = fVar15;
        }
        if (is_outer_docking) {
          fVar21 = (float)(int)(fVar20 * 1.5);
          fVar20 = (float)(int)(fVar20 * 0.8);
          fVar18 = (float)(int)(fVar18 * 0.5 - fVar20);
          fVar15 = (float)(int)(fVar19 * 0.5 - fVar20);
        }
        else {
          fVar21 = (float)(int)fVar20;
          fVar20 = (float)(int)(fVar20 * 0.9);
          fVar18 = (float)(int)(fVar21 * 2.4);
          fVar15 = fVar18;
        }
        fVar16 = (float)(int)((fVar16 + fVar23) * 0.5);
        fVar17 = (float)(int)((fVar17 + fVar22) * 0.5);
        if (lVar9 == 0) {
          fVar19 = fVar16 - fVar21;
          fVar15 = fVar21 + fVar16;
LAB_0016f294:
          fVar22 = fVar17 - fVar21;
          fVar20 = fVar21 + fVar17;
          goto LAB_0016f319;
        }
        switch(uVar8) {
        case 0:
          fVar19 = (fVar16 - fVar15) - fVar20;
          fVar15 = (fVar16 - fVar15) + fVar20;
          goto LAB_0016f294;
        case 1:
          fVar19 = (fVar15 + fVar16) - fVar20;
          fVar22 = fVar17 - fVar21;
          fVar15 = fVar15 + fVar16 + fVar20;
          fVar20 = fVar21 + fVar17;
          break;
        case 2:
          fVar19 = fVar16 - fVar21;
          fVar22 = (fVar17 - fVar18) - fVar20;
          fVar15 = fVar21 + fVar16;
          fVar20 = (fVar17 - fVar18) + fVar20;
          break;
        case 3:
          fVar19 = fVar16 - fVar21;
          fVar22 = (fVar18 + fVar17) - fVar20;
          fVar15 = fVar21 + fVar16;
          fVar20 = fVar18 + fVar17 + fVar20;
          break;
        default:
          goto switchD_0016f256_default;
        }
LAB_0016f319:
        *(float *)((long)&data->DropRectsDraw[0].Min.x + lVar9) = fVar19;
        *(float *)((long)&data->DropRectsDraw[0].Min.y + lVar9) = fVar22;
        *(float *)((long)&data->DropRectsDraw[0].Max.x + lVar9) = fVar15;
        *(float *)((long)&data->DropRectsDraw[0].Max.y + lVar9) = fVar20;
switchD_0016f256_default:
        fVar15 = *(float *)((long)&data->DropRectsDraw[0].Min.x + lVar9);
        fVar18 = *(float *)((long)&data->DropRectsDraw[0].Min.y + lVar9);
        fVar19 = *(float *)((long)&data->DropRectsDraw[0].Max.x + lVar9);
        fVar22 = *(float *)((long)&data->DropRectsDraw[0].Max.y + lVar9);
        if (is_outer_docking) {
LAB_0016f42c:
          fVar16 = (pIVar3->IO).MousePos.x;
          if (fVar16 < fVar15) goto LAB_0016f471;
          fVar17 = (pIVar3->IO).MousePos.y;
          bVar13 = fVar17 < fVar22 && (fVar18 <= fVar17 && fVar16 < fVar19);
        }
        else {
          fVar16 = (pIVar3->IO).MousePos.x - fVar16;
          fVar17 = (pIVar3->IO).MousePos.y - fVar17;
          fVar23 = fVar16 * fVar16 + fVar17 * fVar17;
          if (fVar23 < fVar21 * 1.4 * fVar21 * 1.4) {
LAB_0016f40c:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (fVar23 < fVar21 * 2.6 * fVar21 * 2.6) {
              uVar14 = (uint)(0.0 < fVar16);
              if (ABS(fVar16) <= ABS(fVar17)) {
                uVar14 = 0.0 < fVar17 | 2;
              }
              bVar13 = uVar8 == uVar14;
              goto LAB_0016f40c;
            }
          }
          if (bVar12) {
            fVar16 = (float)(int)(fVar21 * 0.3);
            fVar15 = fVar15 - fVar16;
            fVar18 = fVar18 - fVar16;
            fVar19 = fVar19 + fVar16;
            fVar22 = fVar22 + fVar16;
            goto LAB_0016f42c;
          }
        }
        if (bVar13) {
          data->SplitDir = uVar8;
          data->IsSplitDirExplicit = true;
        }
      }
LAB_0016f471:
      lVar9 = lVar9 + 0x10;
      uVar8 = uVar8 + 1;
    } while (lVar9 != 0x50);
  }
  uVar8 = data->SplitDir;
  bVar13 = true;
  if (uVar8 == 0xffffffff) {
    bVar13 = data->IsCenterAvailable;
  }
  data->IsDropAllowed = bVar13;
  if (((!is_explicit_target) && (data->IsSplitDirExplicit == false)) &&
     ((pIVar3->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (uVar8 != 0xffffffff) {
    bVar12 = uVar8 < 2;
    bVar13 = !bVar12;
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_48 = (data->FutureNode).Pos;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_38 = (data->FutureNode).Size;
    local_30 = root_payload->Size;
    fVar16 = (pIVar3->Style).ItemInnerSpacing.x;
    (&local_40.x)[bVar12] = (&local_48.x)[bVar12];
    (&local_50.x)[bVar12] = (&local_38.x)[bVar12];
    uVar4 = (ulong)((uint)bVar13 * 4);
    fVar15 = *(float *)((long)&local_38.x + uVar4) - fVar16;
    fVar17 = *(float *)((long)&local_30.x + uVar4);
    fVar18 = fVar15 * 0.5;
    if (fVar17 <= 0.0 || fVar18 < fVar17) {
      fVar17 = (float)(int)fVar18;
    }
    *(float *)((long)&local_50.x + uVar4) = fVar17;
    fVar17 = (float)(int)(fVar15 - fVar17);
    *(float *)((long)&local_38.x + uVar4) = fVar17;
    uVar8 = uVar8 & 0xfffffffd;
    if (uVar8 == 0) {
      uVar4 = (ulong)((uint)bVar13 * 4);
      fVar17 = *(float *)((long)&local_48.x + uVar4);
      *(float *)((long)&local_40.x + uVar4) = fVar17;
      *(float *)((long)&local_48.x + uVar4) =
           fVar16 + fVar17 + *(float *)((long)&local_50.x + uVar4);
    }
    else if (uVar8 == 1) {
      *(float *)((long)&local_40.x + (ulong)((uint)bVar13 * 4)) =
           fVar16 + fVar17 + *(float *)((long)&local_48.x + (ulong)((uint)bVar13 * 4));
    }
    fVar17 = (&local_50.x)[bVar13] /
             *(float *)((long)(data->FutureNode).ChildNodes + (ulong)bVar13 * 4 + 0x30);
    fVar16 = 1.0;
    if (fVar17 <= 1.0) {
      fVar16 = fVar17;
    }
    fVar16 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar16);
    (data->FutureNode).Pos = local_40;
    (data->FutureNode).Size = local_50;
    if (uVar8 == 1) {
      fVar16 = 1.0 - fVar16;
    }
    data->SplitRatio = fVar16;
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->MergedFlags : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->MergedFlags : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe)
        data->IsCenterAvailable = false;
    else if ((src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther) && (!host_node || !host_node->IsEmpty()))
        data->IsCenterAvailable = false;
    else if ((src_node_flags & ImGuiDockNodeFlags_NoDockingOverEmpty) && host_node && host_node->IsEmpty())
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}